

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

iterator __thiscall
pstd::vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
insert<pbrt::ShapeHandle*>
          (vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>> *this,
          const_iterator pos,ShapeHandle *first,ShapeHandle *last)

{
  long lVar1;
  ShapeHandle *iter;
  
  lVar1 = *(long *)(this + 0x18);
  if ((const_iterator)(*(long *)(this + 8) + lVar1 * 8) != pos) {
    pbrt::LogFatal(Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0x38d,"TODO");
  }
  for (; first != last; first = first + 1) {
    vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::push_back
              ((vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
               this,first);
  }
  return (iterator)(lVar1 * 8 + *(long *)(this + 8));
}

Assistant:

PBRT_CPU_GPU
    iterator end() { return ptr + nStored; }